

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

int __thiscall TPZFNMatrix<54,_double>::ClassId(TPZFNMatrix<54,_double> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"TPZFNMatrix",&local_31);
  uVar1 = Hash(&local_30);
  iVar2 = TPZFMatrix<double>::ClassId(&this->super_TPZFMatrix<double>);
  std::__cxx11::string::~string((string *)&local_30);
  return uVar1 ^ iVar2 * 2 ^ 0xd8;
}

Assistant:

int TPZFNMatrix<N, TVar>::ClassId() const{
    return Hash("TPZFNMatrix") ^ TPZFMatrix<TVar>::ClassId() << 1 ^ (N << 2);
}